

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O0

RecoveryTest * __thiscall
leveldb::RecoveryTest::Get(RecoveryTest *this,string *k,Snapshot *snapshot)

{
  long *plVar1;
  bool bVar2;
  Status local_88 [6];
  Slice local_58;
  ReadOptions local_48;
  Status local_38;
  Status s;
  Snapshot *snapshot_local;
  string *k_local;
  RecoveryTest *this_local;
  string *result;
  
  s.state_._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  plVar1 = *(long **)(k + 0x28);
  local_48.verify_checksums = false;
  local_48.fill_cache = false;
  local_48._2_6_ = 0;
  local_48.snapshot = (Snapshot *)0x0;
  ReadOptions::ReadOptions(&local_48);
  Slice::Slice(&local_58,(string *)snapshot);
  (**(code **)(*plVar1 + 0x28))(&local_38,plVar1,&local_48,&local_58,this);
  bVar2 = Status::IsNotFound(&local_38);
  if (bVar2) {
    std::__cxx11::string::operator=((string *)this,"NOT_FOUND");
  }
  else {
    bVar2 = Status::ok(&local_38);
    if (!bVar2) {
      Status::ToString_abi_cxx11_(local_88);
      std::__cxx11::string::operator=((string *)this,(string *)local_88);
      std::__cxx11::string::~string((string *)local_88);
    }
  }
  s.state_._7_1_ = 1;
  Status::~Status(&local_38);
  if ((s.state_._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

std::string Get(const std::string& k, const Snapshot* snapshot = nullptr) {
    std::string result;
    Status s = db_->Get(ReadOptions(), k, &result);
    if (s.IsNotFound()) {
      result = "NOT_FOUND";
    } else if (!s.ok()) {
      result = s.ToString();
    }
    return result;
  }